

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O1

void __thiscall Scalar::setParameter(Scalar *this,string *name,string *value)

{
  int iVar1;
  stringstream parameter;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 != 0) {
    Parametric::setParameter((Parametric *)this,name,value);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(value->_M_dataplus)._M_p,value->_M_string_length);
  std::istream::_M_extract<double>((double *)local_1a0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return;
}

Assistant:

void Scalar::setParameter(const string& name, const string& value)
{
	if (name=="value") {
		stringstream parameter;
		parameter << value;
		parameter >> scalarValue;
	} else
		StochasticFunction::setParameter(name, value);
}